

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O3

size_t rtosc::helpers::get_value_from_runtime
                 (void *runtime,Port *port,size_t loc_size,char *loc,char *portname_from_base,
                 size_t buffersize,size_t max_args,rtosc_arg_val_t *arg_vals,
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *scratch_bufs)

{
  char *pcVar1;
  _Invoker_type p_Var2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  Port *dest;
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  Capture d;
  
  lVar3 = -(buffersize + 0xf & 0xfffffffffffffff0);
  dest = (Port *)((long)&d + lVar3 + -8);
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c690;
  fast_strcpy((char *)dest,loc,buffersize);
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c698;
  sVar4 = strlen((char *)dest);
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c6aa;
  RtData::RtData((RtData *)local_e8);
  local_e8 = (undefined1  [8])&PTR__RtData_00120ca0;
  d.super_RtData.idx._56_8_ = max_args;
  d.max_args = (size_t)arg_vals;
  d.arg_vals._0_4_ = -1;
  d._136_8_ = scratch_bufs;
  d.super_RtData.obj._0_4_ = 0;
  pcVar1 = (char *)((long)&dest->name + sVar4);
  d.super_RtData._vptr_RtData = (_func_int **)loc;
  d.super_RtData.loc = (char *)loc_size;
  d.super_RtData.loc_size = (size_t)runtime;
  d.super_RtData._32_8_ = port;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(char *)((long)&dest->name + (sVar4 & 0xfffffffffffffffc) + 4) = ',';
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c712;
  sVar4 = strlen((char *)dest);
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c721;
  sVar5 = strlen(portname_from_base);
  d.scratch_bufs =
       (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        *)((long)dest + (sVar4 - sVar5));
  d.super_RtData.port = dest;
  if ((port->cb).super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var2 = (port->cb)._M_invoker;
    *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c748;
    (*p_Var2)((_Any_data *)&port->cb,(char **)&d.scratch_bufs,(RtData *)local_e8);
    return (long)(int)d.arg_vals;
  }
  *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x10c763;
  std::__throw_bad_function_call();
}

Assistant:

size_t get_value_from_runtime(void* runtime, const Port& port,
                              size_t loc_size, char* loc,
                              const char* portname_from_base,
                              std::size_t buffersize,
                              std::size_t max_args, rtosc_arg_val_t* arg_vals,
                              std::vector<std::vector<char> >* scratch_bufs)
{
    assert(portname_from_base);

    STACKALLOC(char, buffer_with_port, buffersize);
    fast_strcpy(buffer_with_port, loc, buffersize);
    std::size_t addr_len = strlen(buffer_with_port);

    Capture d(max_args, arg_vals, scratch_bufs);
    d.obj = runtime;
    d.loc_size = loc_size;
    d.loc = loc;
    d.port = &port;
    d.matches = 0;
    assert(*loc == '/');

    // does the message at least fit the arguments?
    assert(buffersize - addr_len >= 8);
    // append type
    memset(buffer_with_port + addr_len, 0, 8); // cover string end and arguments
    buffer_with_port[addr_len + (4-addr_len%4)] = ',';

    // TODO? code duplication

    // buffer_with_port is a message in this call:
    const char* start_of_port_in_msg = buffer_with_port + strlen(buffer_with_port) - strlen(portname_from_base);
    assert(start_of_port_in_msg);
    assert(!strcmp(start_of_port_in_msg, portname_from_base));
    d.message = buffer_with_port;
    port.cb(start_of_port_in_msg, d);

    assert(d.size() >= 0);
    return d.size();
}